

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QAsn1Element>::emplace<QAsn1Element_const&>
          (QMovableArrayOps<QAsn1Element> *this,qsizetype i,QAsn1Element *args)

{
  QAsn1Element **ppQVar1;
  QAsn1Element *pQVar2;
  quint8 qVar3;
  Data *pDVar4;
  long lVar5;
  Data *pDVar6;
  char *pcVar7;
  qsizetype qVar8;
  QAsn1Element *pQVar9;
  qsizetype *pqVar10;
  bool bVar11;
  
  pDVar4 = (this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    lVar5 = (this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>.size;
    if ((lVar5 == i && pDVar4 != (Data *)0x0) &&
       ((pDVar4->super_QArrayData).alloc !=
        ((long)((long)(this->super_QGenericArrayOps<QAsn1Element>).
                      super_QArrayDataPointer<QAsn1Element>.ptr -
               ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 5) +
        lVar5)) {
      pQVar9 = (this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>.
               ptr;
      pQVar9[lVar5].mType = args->mType;
      pDVar6 = (args->mValue).d.d;
      pQVar9[lVar5].mValue.d.d = pDVar6;
      pQVar9[lVar5].mValue.d.ptr = (args->mValue).d.ptr;
      pQVar9[lVar5].mValue.d.size = (args->mValue).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_00115a30;
    }
    if (((i == 0) && (pDVar4 != (Data *)0x0)) &&
       ((QAsn1Element *)((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
        != (this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>.ptr))
    {
      pQVar9 = (this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>.
               ptr;
      pQVar9[-1].mType = args->mType;
      pDVar6 = (args->mValue).d.d;
      pQVar9[-1].mValue.d.d = pDVar6;
      pQVar9[-1].mValue.d.ptr = (args->mValue).d.ptr;
      pQVar9[-1].mValue.d.size = (args->mValue).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ppQVar1 = &(this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>.
                 ptr;
      *ppQVar1 = *ppQVar1 + -1;
      goto LAB_00115a30;
    }
  }
  qVar3 = args->mType;
  pDVar6 = (args->mValue).d.d;
  pcVar7 = (args->mValue).d.ptr;
  qVar8 = (args->mValue).d.size;
  if (pDVar6 != (Data *)0x0) {
    LOCK();
    (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  bVar11 = (this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>.size
           != 0;
  QArrayDataPointer<QAsn1Element>::detachAndGrow
            ((QArrayDataPointer<QAsn1Element> *)this,(uint)(i == 0 && bVar11),1,(QAsn1Element **)0x0
             ,(QArrayDataPointer<QAsn1Element> *)0x0);
  pQVar9 = (this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>.ptr;
  if (i == 0 && bVar11) {
    pQVar9[-1].mType = qVar3;
    pQVar9[-1].mValue.d.d = pDVar6;
    pQVar9[-1].mValue.d.ptr = pcVar7;
    pQVar9[-1].mValue.d.size = qVar8;
    (this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>.ptr =
         pQVar9 + -1;
  }
  else {
    pQVar2 = pQVar9 + i;
    memmove(pQVar2 + 1,pQVar9 + i,
            ((this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>.size
            - i) * 0x20);
    pQVar2->mType = qVar3;
    (pQVar2->mValue).d.d = pDVar6;
    (pQVar2->mValue).d.ptr = pcVar7;
    (pQVar2->mValue).d.size = qVar8;
  }
LAB_00115a30:
  pqVar10 = &(this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>.size
  ;
  *pqVar10 = *pqVar10 + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }